

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# digit_comparison.h
# Opt level: O3

adjusted_mantissa __thiscall
fast_float::negative_digit_comp<float>
          (fast_float *this,bigint *bigmant,adjusted_mantissa am,int32_t exponent)

{
  ushort uVar1;
  ulong uVar2;
  byte bVar3;
  byte bVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  fast_float *this_00;
  uint uVar11;
  int iVar12;
  bool bVar13;
  adjusted_mantissa aVar14;
  bigint theor_digits;
  bigint local_228;
  
  iVar8 = am.power2;
  iVar10 = (int)am.mantissa;
  if (iVar10 < -0x27) {
    iVar9 = 1 - iVar10;
    iVar12 = 0;
    if (iVar9 < 0x40) {
      iVar12 = iVar9;
    }
    uVar6 = 0;
    if (iVar9 < 0x40) {
      uVar6 = (ulong)bigmant >> ((byte)iVar12 & 0x3f);
    }
    uVar11 = (uint)(0x7fffff < uVar6);
  }
  else {
    uVar6 = 0;
    uVar11 = 0xff;
    if (iVar10 < 0xd7) {
      uVar6 = (ulong)((uint)((ulong)bigmant >> 0x28) & 0x7fffff);
      uVar11 = iVar10 + 0x28;
    }
  }
  uVar5 = (uint)uVar6;
  uVar11 = (uVar11 << 0x17 | uVar5) & 0x7f800000;
  if (uVar11 == 0) {
    uVar6 = (ulong)(uVar5 & 0x7fffff);
    iVar12 = -0x96;
  }
  else {
    uVar6 = (ulong)(uVar5 & 0x7fffff) | 0x800000;
    iVar12 = (uVar11 >> 0x17) - 0x97;
  }
  memset(local_228.vec.data + 1,0,0x1f0);
  local_228.vec.data[0] = uVar6 * 2 + 1;
  local_228.vec.length = 1;
  uVar11 = iVar12 - iVar8;
  if (iVar8 != 0) {
    bigint::pow5(&local_228,-iVar8);
  }
  if ((int)uVar11 < 1) {
    if ((int)uVar11 < 0) {
      uVar11 = -uVar11;
      this_00 = this;
      goto LAB_00427f5d;
    }
  }
  else {
    this_00 = (fast_float *)&local_228;
LAB_00427f5d:
    bigint::shl((bigint *)this_00,(ulong)uVar11);
  }
  uVar1 = *(ushort *)(this + 0x1f0);
  bVar4 = 1;
  bVar3 = 1;
  if (uVar1 <= local_228.vec.length) {
    uVar6 = (ulong)uVar1;
    if (local_228.vec.length <= uVar1) {
      do {
        bVar13 = uVar6 == 0;
        uVar7 = uVar6 - 1;
        if (bVar13) break;
        uVar2 = local_228.vec.data[uVar6 - 1];
        if (uVar2 < *(ulong *)(this + uVar7 * 8)) goto LAB_00427f8d;
        uVar6 = uVar7;
      } while (uVar2 <= *(ulong *)(this + uVar7 * 8));
      bVar4 = 0;
      goto LAB_00427f8d;
    }
    bVar3 = 0;
  }
  bVar4 = bVar3;
  bVar13 = false;
LAB_00427f8d:
  if (iVar10 < -0x27) {
    iVar10 = 1 - iVar10;
    iVar8 = 0;
    if (iVar10 < 0x40) {
      iVar8 = iVar10;
    }
    uVar6 = 0;
    if (iVar10 < 0x40) {
      uVar6 = (ulong)bigmant >> ((byte)iVar8 & 0x3f);
    }
    uVar6 = (byte)(bVar4 | bVar13 & (byte)uVar6) + uVar6;
    uVar7 = (ulong)(0x7fffff < uVar6);
  }
  else {
    uVar7 = (ulong)(byte)(bVar4 | (byte)((ulong)bigmant >> 0x28) & 1 & bVar13) +
            ((ulong)bigmant >> 0x28);
    uVar11 = (uVar7 < 0x1000000 ^ 0x29) + iVar10;
    uVar6 = (ulong)((uint)uVar7 & 0x17fffff);
    if (uVar7 >= 0x1000000) {
      uVar6 = 0;
    }
    uVar5 = uVar11;
    if (0xfe < uVar11) {
      uVar5 = 0xff;
    }
    uVar7 = (ulong)uVar5;
    if (0xfe < uVar11) {
      uVar6 = 0;
    }
  }
  aVar14._8_8_ = uVar7;
  aVar14.mantissa = uVar6;
  return aVar14;
}

Assistant:

inline FASTFLOAT_CONSTEXPR20
adjusted_mantissa negative_digit_comp(bigint& bigmant, adjusted_mantissa am, int32_t exponent) noexcept {
  bigint& real_digits = bigmant;
  int32_t real_exp = exponent;

  // get the value of `b`, rounded down, and get a bigint representation of b+h
  adjusted_mantissa am_b = am;
  // gcc7 buf: use a lambda to remove the noexcept qualifier bug with -Wnoexcept-type.
  round<T>(am_b, [](adjusted_mantissa&a, int32_t shift) { round_down(a, shift); });
  T b;
  to_float(false, am_b, b);
  adjusted_mantissa theor = to_extended_halfway(b);
  bigint theor_digits(theor.mantissa);
  int32_t theor_exp = theor.power2;

  // scale real digits and theor digits to be same power.
  int32_t pow2_exp = theor_exp - real_exp;
  uint32_t pow5_exp = uint32_t(-real_exp);
  if (pow5_exp != 0) {
    FASTFLOAT_ASSERT(theor_digits.pow5(pow5_exp));
  }
  if (pow2_exp > 0) {
    FASTFLOAT_ASSERT(theor_digits.pow2(uint32_t(pow2_exp)));
  } else if (pow2_exp < 0) {
    FASTFLOAT_ASSERT(real_digits.pow2(uint32_t(-pow2_exp)));
  }

  // compare digits, and use it to director rounding
  int ord = real_digits.compare(theor_digits);
  adjusted_mantissa answer = am;
  round<T>(answer, [ord](adjusted_mantissa& a, int32_t shift) {
    round_nearest_tie_even(a, shift, [ord](bool is_odd, bool _, bool __) -> bool {
      (void)_;  // not needed, since we've done our comparison
      (void)__; // not needed, since we've done our comparison
      if (ord > 0) {
        return true;
      } else if (ord < 0) {
        return false;
      } else {
        return is_odd;
      }
    });
  });

  return answer;
}